

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O0

void vocerr_va_prep(voccxdef *ctx,vocerr_va_info *info,int err,char *f,__va_list_tag *argptr)

{
  char cVar1;
  ushort uVar2;
  long lVar3;
  void *p_00;
  int iVar4;
  runcxdef *in_RCX;
  runcxdef *prVar5;
  void *in_RSI;
  long in_RDI;
  uint *in_R8;
  int in_stack_00000008;
  objnum in_stack_0000000e;
  runcxdef *in_stack_00000010;
  char *p_1;
  char *p;
  argbuf_t *argp;
  argbuf_t args [5];
  int argc;
  size_t len;
  dattyp typ;
  runcxdef *rcx;
  undefined8 in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  uint uVar6;
  char *in_stack_fffffffffffffed8;
  char *str;
  runcxdef *in_stack_fffffffffffffee0;
  undefined4 *local_f8;
  int *local_e0;
  undefined8 *local_c8;
  runcxdef *local_a8;
  int *local_a0;
  int local_98 [2];
  int local_90 [19];
  int local_44;
  size_t local_40;
  uint local_34;
  char *local_30;
  uint *local_28;
  runcxdef *local_20;
  void *local_10;
  long local_8;
  
  iVar4 = (int)((ulong)in_stack_fffffffffffffec8 >> 0x20);
  *(runcxdef **)((long)in_RSI + 400) = in_RCX;
  *(void **)((long)in_RSI + 0x198) = in_RSI;
  *(undefined8 *)((long)in_RSI + 0x1a0) = 400;
  if ((*(short *)(in_RDI + 0x10ec) != -1) || (*(short *)(in_RDI + 0x10f6) != -1)) {
    local_30 = *(char **)(in_RDI + 0x10);
    local_44 = 2;
    local_20 = in_RCX;
    local_10 = in_RSI;
    local_8 = in_RDI;
    if (*(short *)(in_RDI + 0x10f6) != -1) {
      local_a0 = local_98;
      local_28 = in_R8;
      for (local_a8 = in_RCX; *(char *)&local_a8->runcxerr != '\0';
          local_a8 = (runcxdef *)((long)&local_a8->runcxerr + 1)) {
        if (*(char *)&local_a8->runcxerr == '%') {
          prVar5 = (runcxdef *)((long)&local_a8->runcxerr + 1);
          cVar1 = *(char *)((long)&local_a8->runcxerr + 1);
          local_a8 = prVar5;
          if (cVar1 == 'c') {
            uVar6 = *local_28;
            if (uVar6 < 0x29) {
              local_f8 = (undefined4 *)((long)(int)uVar6 + *(long *)(local_28 + 4));
              *local_28 = uVar6 + 8;
            }
            else {
              local_f8 = *(undefined4 **)(local_28 + 2);
              *(undefined4 **)(local_28 + 2) = local_f8 + 2;
            }
            *(char *)(local_a0 + 2) = (char)*local_f8;
            *local_a0 = 2;
            local_a0 = local_a0 + 4;
          }
          else if (cVar1 == 'd') {
            uVar6 = *local_28;
            if (uVar6 < 0x29) {
              local_e0 = (int *)((long)(int)uVar6 + *(long *)(local_28 + 4));
              *local_28 = uVar6 + 8;
            }
            else {
              local_e0 = *(int **)(local_28 + 2);
              *(int **)(local_28 + 2) = local_e0 + 2;
            }
            local_a0[2] = *local_e0;
            *local_a0 = 1;
            local_a0 = local_a0 + 4;
          }
          else if (cVar1 == 's') {
            uVar6 = *local_28;
            if (uVar6 < 0x29) {
              local_c8 = (undefined8 *)((long)(int)uVar6 + *(long *)(local_28 + 4));
              *local_28 = uVar6 + 8;
            }
            else {
              local_c8 = *(undefined8 **)(local_28 + 2);
              *(undefined8 **)(local_28 + 2) = local_c8 + 1;
            }
            *(undefined8 *)(local_a0 + 2) = *local_c8;
            *local_a0 = 0;
            local_a0 = local_a0 + 4;
          }
        }
      }
      while (iVar4 = (int)((ulong)in_stack_fffffffffffffec8 >> 0x20), local_a0 != local_98) {
        iVar4 = local_a0[-4];
        if (iVar4 == 0) {
          strlen(*(char **)(local_a0 + -2));
          runpstr(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,
                  in_stack_fffffffffffffed0);
        }
        else if (iVar4 == 1) {
          runpnum(in_stack_fffffffffffffee0,(long)in_stack_fffffffffffffed8);
        }
        else if (iVar4 == 2) {
          runpstr(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,
                  in_stack_fffffffffffffed0);
        }
        local_44 = local_44 + 1;
        local_a0 = local_a0 + -4;
      }
    }
    str = local_30;
    strlen((char *)local_20);
    runpstr(local_20,str,in_stack_fffffffffffffed4,in_stack_fffffffffffffed0);
    runpnum(local_20,(long)str);
    if (*(short *)(local_8 + 0x10f6) == -1) {
      uVar2 = *(ushort *)(local_8 + 0x10ec);
    }
    else {
      uVar2 = *(ushort *)(local_8 + 0x10f6);
    }
    uVar6 = (uint)uVar2;
    runfn(in_stack_00000010,in_stack_0000000e,in_stack_00000008);
    local_34 = (uint)*(byte *)(*(long *)(local_30 + 0x20) + -0x10);
    if (local_34 == 3) {
      lVar3 = *(long *)(local_30 + 0x20);
      *(long *)(local_30 + 0x20) = lVar3 + -0x10;
      if (*(char *)(lVar3 + -0x10) != '\x03') {
        *(undefined4 *)(**(long **)local_30 + 0x68) = 0;
        runsign((runcxdef *)CONCAT44(uVar6,in_stack_fffffffffffffed0),iVar4);
      }
      p_00 = *(void **)(*(long *)(local_30 + 0x20) + 8);
      iVar4 = osrp2(p_00);
      local_40 = (size_t)(iVar4 + -2);
      if (399 < local_40) {
        local_40 = 399;
      }
      memcpy(local_10,(void *)((long)p_00 + 2),local_40);
      *(undefined1 *)((long)local_10 + local_40) = 0;
      *(void **)((long)local_10 + 400) = local_10;
      *(size_t *)((long)local_10 + 0x198) = (long)local_10 + local_40 + 1;
      *(size_t *)((long)local_10 + 0x1a0) = 399 - local_40;
    }
    else {
      *(long *)(local_30 + 0x20) = *(long *)(local_30 + 0x20) + -0x10;
    }
  }
  return;
}

Assistant:

static void vocerr_va_prep(voccxdef *ctx, struct vocerr_va_info *info,
                           int err, char *f, va_list argptr)
{
    /* 
     *   presume that we'll use the given format string, instead of one
     *   provided by the program 
     */
    info->fmt = f;

    /* use the output buffer from the info structure */
    info->outp = info->user_msg;
    info->outsiz = sizeof(info->user_msg);

    /* 
     *   if the user has a parseError or parseErrorParam function, see if it
     *   provides a msg 
     */
    if (ctx->voccxper != MCMONINV || ctx->voccxperp != MCMONINV)
    {
        runcxdef *rcx = ctx->voccxrun;
        dattyp    typ;
        size_t    len;
        int       argc;

        /* start off with the two arguments that are always present */
        argc = 2;

        /* 
         *   if we're calling parseErrorParam, and we have additional
         *   arguments, push them as well 
         */
        if (ctx->voccxperp != MCMONINV)
        {
            enum typ_t
            {
                ARGBUF_STR, ARGBUF_INT, ARGBUF_CHAR
            };
            struct argbuf_t
            {
                enum typ_t typ;
                union
                {
                    char *strval;
                    int   intval;
                    char  charval;
                } val;
            };
            struct argbuf_t  args[5];
            struct argbuf_t *argp;
            char  *p;

            /* 
             *   Retrieve the arguments by examining the format string.  We
             *   must buffer up the arguments before pushing them, because
             *   we need to push them in reverse order (last to first); so,
             *   we must scan all arguments before we push the first one.  
             */
            for (p = f, argp = args ; *p != '\0' ; ++p)
            {
                /* check if this is a parameter */
                if (*p == '%')
                {
                    /* find out what type it is */
                    switch(*++p)
                    {
                    case 's':
                        /* string - save the char pointer */
                        argp->val.strval = va_arg(argptr, char *);
                        argp->typ = ARGBUF_STR;

                        /* consume an argument slot */
                        ++argp;
                        break;

                    case 'd':
                        /* integer - save the integer */
                        argp->val.intval = va_arg(argptr, int);
                        argp->typ = ARGBUF_INT;

                        /* consume an argument slot */
                        ++argp;
                        break;

                    case 'c':
                        /* character */
                        argp->val.charval = (char)va_arg(argptr, int);
                        argp->typ = ARGBUF_CHAR;

                        /* consume an argument slot */
                        ++argp;
                        break;

                    default:
                        /* 
                         *   ignore other types (there shouldn't be any
                         *   other types anyway) 
                         */
                        break;
                    }
                }
            }

            /*
             *   Push the arguments - keep looping until we get back to the
             *   first argument slot 
             */
            while (argp != args)
            {
                /* move to the next argument, working backwards */
                --argp;

                /* push this argument */
                switch(argp->typ)
                {
                case ARGBUF_STR:
                    /* push the string value */
                    runpstr(rcx, argp->val.strval,
                            (int)strlen(argp->val.strval), 0);
                    break;

                case ARGBUF_INT:
                    /* push the number value */
                    runpnum(rcx, argp->val.intval);
                    break;

                case ARGBUF_CHAR:
                    /* push the character as a one-character string */
                    runpstr(rcx, &argp->val.charval, 1, 0);
                    break;
                }

                /* count the argument */
                ++argc;
            }
        }

        /* push standard arguments: error code and default message */
        runpstr(rcx, f, (int)strlen(f), 0);         /* 2nd arg: default msg */
        runpnum(rcx, (long)err);                   /* 1st arg: error number */

        /* invoke parseErrorParam if it's defined, otherwise parseError */
        runfn(rcx, (objnum)(ctx->voccxperp == MCMONINV
                            ? ctx->voccxper : ctx->voccxperp), argc);

        /* see what the function returned */
        typ = runtostyp(rcx);
        if (typ == DAT_SSTRING)
        {
            char *p;
            
            /* 
             *   they returned a string - use it as the error message
             *   instead of the default message 
             */
            p = (char *)runpopstr(rcx);
            len = osrp2(p) - 2;
            p += 2;
            if (len > sizeof(info->user_msg) - 1)
                len = sizeof(info->user_msg) - 1;
            memcpy(info->user_msg, p, len);
            info->user_msg[len] = '\0';

            /* use the returned string as the message to display */
            info->fmt = info->user_msg;

            /* use the remainder of the buffer for the final formatting */
            info->outp = info->user_msg + len + 1;
            info->outsiz = sizeof(info->user_msg) - len - 1;
        }
        else
        {
            /* ignore other return values */
            rundisc(rcx);
        }
    }

}